

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O0

MPP_RET vdpu383_av1d_gen_regs(void *hal,HalTaskInfo *task)

{
  RK_U32 *pRVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  RK_U32 RVar20;
  int iVar21;
  UINT32 UVar22;
  MppFrameFormat MVar23;
  size_t sVar24;
  SWREG18_ERR_ROI_CTU_OFFSET_END SVar25;
  uint uVar26;
  MppBuffer local_c0;
  MppFrameThumbnailMode thumbnail_mode;
  RK_S32 fd;
  MppBuffer mbuffer_2;
  HalBuf *mv_buf;
  MppBuffer pvStack_88;
  RK_U32 mapped_idx_1;
  MppBuffer mbuffer_1;
  RK_U32 h;
  RK_U32 fbc_hdr_stride;
  RK_U32 fbd_offset;
  RK_U32 mapped_idx;
  RK_U32 uv_virstride;
  RK_U32 y_virstride;
  RK_U32 ver_virstride;
  RK_U32 hor_virstride;
  MppBuffer mbuffer;
  MppFrame mframe;
  HalBuf *origin_buf;
  DXVA_PicParams_AV1 *pDStack_40;
  RK_U32 i;
  DXVA_PicParams_AV1 *dxva;
  Vdpu383Av1dRegSet *regs;
  Vdpu383Av1dRegCtx *ctx;
  Av1dHalCtx *p_hal;
  HalTaskInfo *pHStack_18;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  p_hal._4_4_ = 0xfffffffe;
  regs = *(Vdpu383Av1dRegSet **)((long)hal + 0x50);
  pDStack_40 = (DXVA_PicParams_AV1 *)(task->dec).syntax.data;
  origin_buf._4_4_ = 0;
  mframe = (MppFrame)0x0;
  ctx = (Vdpu383Av1dRegCtx *)hal;
  pHStack_18 = task;
  task_local = (HalTaskInfo *)hal;
  if (hal == (void *)0x0) {
    p_hal._4_4_ = 0xfffffc16;
    if ((hal_av1d_debug & 4) != 0) {
      _mpp_log_l(4,"hal_av1d_vdpu383","input empty(%d).\n",(char *)0x0,0x88a);
    }
  }
  else {
    SVar25._1_3_ = 0;
    SVar25._0_1_ = pDStack_40->refresh_frame_flags;
    regs[0xa9].ctrl_regs.reg18 = SVar25;
    if ((((task->dec).flags.val >> 2 & 1) == 0) && (((task->dec).flags.val >> 3 & 1) == 0)) {
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)((long)hal + 0x20),
                 (uint)((pDStack_40->CurrPic).field_0.bPicEntry & 0x7f),SLOT_FRAME_PTR,&mbuffer);
      RVar20 = mpp_frame_get_thumbnail_en(mbuffer);
      if (RVar20 == 2) {
        if (pDStack_40->height < pDStack_40->width) {
          uVar2 = pDStack_40->width;
        }
        else {
          uVar2 = pDStack_40->height;
        }
        if ((0x1000 < uVar2) &&
           (lVar18._0_4_ = regs[0xbd].av1d_addrs.reg207_payload_st_ref12_base,
           lVar18._4_4_ = regs[0xbd].av1d_addrs.reg208_payload_st_ref13_base, lVar18 == 0)) {
          vdpu383_setup_scale_origin_bufs((Av1dHalCtx *)ctx,mbuffer);
        }
      }
      if (ctx->uncmps_offset[0] != 0) {
        for (origin_buf._4_4_ = 0; origin_buf._4_4_ < 3; origin_buf._4_4_ = origin_buf._4_4_ + 1) {
          if ((regs->ctrl_regs).reserve_reg24_26[(ulong)origin_buf._4_4_ * 4 + -0xd] == 0) {
            (pHStack_18->dec).reg_index = origin_buf._4_4_;
            pRVar1 = (regs->ctrl_regs).reserve_reg24_26 + (ulong)origin_buf._4_4_ * 4 + -0xb;
            RVar20 = pRVar1[1];
            regs->reg_version = (Vdpu383RegVersion)pRVar1[0];
            (regs->ctrl_regs).reg8_dec_mode = RVar20;
            (regs->ctrl_regs).reserve_reg24_26[(ulong)origin_buf._4_4_ * 4 + -0xd] = 1;
            (regs->ctrl_regs).reg9 =
                 *(SWREG9_IMPORTANT_EN *)
                  ((regs->ctrl_regs).reserve_reg24_26 + (ulong)origin_buf._4_4_ + 5);
            break;
          }
        }
      }
      dxva = *(DXVA_PicParams_AV1 **)regs;
      memset(dxva,0,0x298);
      sVar24 = mpp_packet_get_length((pHStack_18->dec).input_packet);
      ctx->reg_buf[0].valid = (RK_U32)sVar24;
      dxva->height = 4;
      dxva->max_width = 0;
      uVar26._0_2_ = dxva->max_height;
      uVar26._2_2_ = dxva->CurrPicTextureIndex;
      dxva->max_height = (short)(uVar26 & 0xfffffffe);
      dxva->CurrPicTextureIndex = (short)((uVar26 & 0xfffffffe) >> 0x10);
      uVar3._0_2_ = dxva->max_height;
      uVar3._2_2_ = dxva->CurrPicTextureIndex;
      dxva->max_height = (short)(uVar3 & 0xffffffef);
      dxva->CurrPicTextureIndex = (short)((uVar3 & 0xffffffef) >> 0x10);
      uVar4._0_2_ = dxva->superres_denom;
      uVar4._2_2_ = dxva->bitdepth;
      uVar26 = uVar4 & 0xfffffffe | 1;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      uVar5._0_2_ = dxva->superres_denom;
      uVar5._2_2_ = dxva->bitdepth;
      uVar26 = uVar5 & 0xfffffffd | 2;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      uVar6._0_2_ = dxva->superres_denom;
      uVar6._2_2_ = dxva->bitdepth;
      uVar26 = uVar6 & 0xfffffffb | 4;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      uVar7._0_2_ = dxva->superres_denom;
      uVar7._2_2_ = dxva->bitdepth;
      uVar26 = uVar7 & 0xfffffff7 | 8;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      uVar8._0_2_ = dxva->superres_denom;
      uVar8._2_2_ = dxva->bitdepth;
      uVar26 = uVar8 & 0xffffffef | 0x10;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      uVar9._0_2_ = dxva->superres_denom;
      uVar9._2_2_ = dxva->bitdepth;
      uVar26 = uVar9 & 0xffffffdf | 0x20;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      uVar10._0_2_ = dxva->superres_denom;
      uVar10._2_2_ = dxva->bitdepth;
      uVar26 = uVar10 & 0xffffffbf | 0x40;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      uVar11._0_2_ = dxva->superres_denom;
      uVar11._2_2_ = dxva->bitdepth;
      uVar26 = uVar11 & 0xffffff7f | 0x80;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      uVar12._0_2_ = dxva->superres_denom;
      uVar12._2_2_ = dxva->bitdepth;
      uVar26 = uVar12 & 0xfffffeff | 0x100;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      uVar13._0_2_ = dxva->superres_denom;
      uVar13._2_2_ = dxva->bitdepth;
      uVar26 = uVar13 & 0xfffffdff | 0x200;
      dxva->superres_denom = (short)uVar26;
      dxva->bitdepth = (short)(uVar26 >> 0x10);
      *(undefined4 *)((long)&dxva->field_10 + 4) = 0x3fffff;
      *(uint *)((dxva->tiles).widths + 1) = *(uint *)((dxva->tiles).widths + 1) & 0xfffffffe | 1;
      *(uint *)((dxva->tiles).widths + 1) = *(uint *)((dxva->tiles).widths + 1) & 0xfffffeff;
      *(uint *)((dxva->tiles).widths + 1) = *(uint *)((dxva->tiles).widths + 1) & 0xfeffffff;
      (dxva->tiles).widths[9] = 0xffdf;
      (dxva->tiles).widths[10] = 0xffff;
      (dxva->tiles).widths[0xb] = 0xffff;
      (dxva->tiles).widths[0xc] = 0x3fff;
      *(uint *)((dxva->tiles).widths + 0x19) =
           *(uint *)((dxva->tiles).widths + 0x19) & 0xfffffffe | 1;
      *(uint *)((dxva->tiles).widths + 0x19) =
           *(uint *)((dxva->tiles).widths + 0x19) & 0xfffffff7 | 8;
      *(uint *)((dxva->tiles).widths + 0x19) =
           *(uint *)((dxva->tiles).widths + 0x19) & 0xfffff00f | 0xb0;
      *(uint *)((dxva->tiles).widths + 0x1b) =
           *(uint *)((dxva->tiles).widths + 0x1b) & 0xfffffffc | 1;
      *(uint *)((dxva->tiles).widths + 0x1b) = *(uint *)((dxva->tiles).widths + 0x1b) & 0xfffffffb;
      *(uint *)((dxva->tiles).widths + 0x1b) =
           *(uint *)((dxva->tiles).widths + 0x1b) & 0xfffffff7 | 8;
      *(uint *)((dxva->tiles).widths + 0x1b) =
           *(uint *)((dxva->tiles).widths + 0x1b) & 0xfffff00f | 0x110;
      *(uint *)((dxva->tiles).widths + 0x1b) = *(uint *)((dxva->tiles).widths + 0x1b) & 0xff00ffff;
      *(uint *)((dxva->tiles).widths + 0x1b) = *(uint *)((dxva->tiles).widths + 0x1b) & 0xfeffffff;
      *(uint *)((dxva->tiles).widths + 0x1d) = *(uint *)((dxva->tiles).widths + 0x1d) & 0xfffff0ff;
      *(uint *)((dxva->tiles).widths + 0x1d) = *(uint *)((dxva->tiles).widths + 0x1d) & 0xf0ffffff;
      _ver_virstride = (MppBuffer)0x0;
      prepare_uncompress_header
                ((Av1dHalCtx *)ctx,pDStack_40,
                 (RK_U64 *)&regs[0xbc].av1d_addrs.reg208_payload_st_ref13_base,0x52);
      memcpy(*(void **)&(regs->ctrl_regs).reg27,&regs[0xbc].av1d_addrs.reg208_payload_st_ref13_base,
             0x290);
      (dxva->tiles).heights[0x29] = 0x29;
      (dxva->tiles).heights[0x2a] = 0;
      *(RK_U32 *)((dxva->tiles).widths + 0x25) = (regs->ctrl_regs).reserve_reg24_26[1];
      sVar24 = mpp_packet_get_length((pHStack_18->dec).input_packet);
      ctx->reg_buf[0].valid = (RK_U32)sVar24;
      *(RK_U32 *)((dxva->tiles).heights + 0x27) = ctx->reg_buf[0].valid + 0x8e & 0xffffff80;
      mpp_buf_slot_get_prop(ctx->reg_buf[1].regs,(pHStack_18->dec).input,SLOT_BUFFER,&ver_virstride)
      ;
      iVar21 = mpp_buffer_get_fd_with_caller(_ver_virstride,"vdpu383_av1d_gen_regs");
      *(int *)((dxva->tiles).widths + 0x1f) = iVar21;
      *(uint *)((dxva->tiles).heights + 0x25) = ((uint)(regs->ctrl_regs).reg9 & 0xf) << 3;
      mpp_dev_set_reg_offset
                (*(MppDev *)&ctx->bufs_fd,0x80,(uint)(regs->ctrl_regs).reg9 & 0xfffffff0);
      UVar22 = mpp_buffer_get_fd_with_caller(_ver_virstride,"vdpu383_av1d_gen_regs");
      (dxva->tiles).tile_offset_start[0x1d] = UVar22;
      vdpu383_av1d_rcb_setup((Av1dHalCtx *)ctx,pDStack_40);
      if (ctx->uncmps_offset[0] == 0) {
        local_c0 = *(MppBuffer *)&(regs->av1d_paras).reg66_stream_len;
      }
      else {
        local_c0 = *(MppBuffer *)
                    ((regs->av1d_paras).reserve_reg75_79 +
                    (long)(pHStack_18->dec).reg_index * 2 + -9);
      }
      vdpu383_av1d_rcb_reg_cfg((Av1dHalCtx *)ctx,local_c0);
      y_virstride = 0;
      uv_virstride = 0;
      mapped_idx = 0;
      fbd_offset = 0;
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)(ctx->reg_buf + 1),
                 (uint)((pDStack_40->CurrPic).field_0.bPicEntry & 0x7f),SLOT_FRAME_PTR,&mbuffer);
      if (mbuffer != (MppBuffer)0x0) {
        y_virstride = mpp_frame_get_hor_stride(mbuffer);
        uv_virstride = mpp_frame_get_ver_stride(mbuffer);
        mapped_idx = y_virstride * uv_virstride;
        fbd_offset = y_virstride * uv_virstride >> 1;
        MVar23 = mpp_frame_get_fmt(mbuffer);
        if ((MVar23 & 0xf00000) == MPP_FMT_YUV420SP) {
          MVar23 = mpp_frame_get_fmt(mbuffer);
          if ((MVar23 & 0x2000000) == MPP_FMT_YUV420SP) {
            uVar16._0_2_ = dxva->max_height;
            uVar16._2_2_ = dxva->CurrPicTextureIndex;
            dxva->max_height = (short)(uVar16 & 0xfffffffe);
            dxva->CurrPicTextureIndex = (short)((uVar16 & 0xfffffffe) >> 0x10);
            *(RK_U32 *)((dxva->tiles).heights + 0x2b) = y_virstride >> 4;
            *(RK_U32 *)((dxva->tiles).heights + 0x2d) = y_virstride >> 4;
            *(RK_U32 *)((dxva->tiles).heights + 0x2f) = mapped_idx >> 4;
          }
          else {
            uVar15._0_2_ = dxva->max_height;
            uVar15._2_2_ = dxva->CurrPicTextureIndex;
            uVar26 = uVar15 & 0xfffffffd | 2;
            dxva->max_height = (short)uVar26;
            dxva->CurrPicTextureIndex = (short)(uVar26 >> 0x10);
            *(RK_U32 *)((dxva->tiles).heights + 0x2b) = y_virstride * 6 + 0xf >> 4;
            *(RK_U32 *)((dxva->tiles).heights + 0x2f) = mapped_idx + fbd_offset >> 4;
          }
        }
        else {
          mbuffer_1._4_4_ = mpp_frame_get_fbc_hdr_stride(mbuffer);
          RVar20 = mpp_frame_get_height(mbuffer);
          mbuffer_1._0_4_ = RVar20 + 0x3f & 0xffffffc0;
          uVar14._0_2_ = dxva->max_height;
          uVar14._2_2_ = dxva->CurrPicTextureIndex;
          uVar26 = uVar14 & 0xfffffffe | 1;
          dxva->max_height = (short)uVar26;
          dxva->CurrPicTextureIndex = (short)(uVar26 >> 0x10);
          *(RK_U32 *)((dxva->tiles).heights + 0x2b) = mbuffer_1._4_4_ >> 6;
          h = *(int *)((dxva->tiles).heights + 0x2b) * (uint)mbuffer_1 * 4;
          (dxva->tiles).tile_offset_start[0x35] = h;
        }
        (dxva->tiles).tile_offset_start[1] = *(UINT32 *)((dxva->tiles).heights + 0x2b);
        (dxva->tiles).tile_offset_start[2] = *(UINT32 *)((dxva->tiles).heights + 0x2d);
        (dxva->tiles).tile_offset_start[3] = *(UINT32 *)((dxva->tiles).heights + 0x2f);
      }
      for (origin_buf._4_4_ = 0; origin_buf._4_4_ < 7; origin_buf._4_4_ = origin_buf._4_4_ + 1) {
        fbc_hdr_stride = pDStack_40->ref_frame_idx[origin_buf._4_4_];
        if (((pDStack_40->frame_refs[fbc_hdr_stride].Index != -1) &&
            (pDStack_40->frame_refs[fbc_hdr_stride].Index != '\x7f')) &&
           (mpp_buf_slot_get_prop
                      (*(MppBufSlots *)(ctx->reg_buf + 1),
                       (int)pDStack_40->frame_refs[fbc_hdr_stride].Index,SLOT_FRAME_PTR,&mbuffer),
           mbuffer != (MppBuffer)0x0)) {
          y_virstride = mpp_frame_get_hor_stride(mbuffer);
          uv_virstride = mpp_frame_get_ver_stride(mbuffer);
          mapped_idx = y_virstride * uv_virstride;
          MVar23 = mpp_frame_get_fmt(mbuffer);
          if ((MVar23 & 0xf00000) == MPP_FMT_YUV420SP) {
            MVar23 = mpp_frame_get_fmt(mbuffer);
            if ((MVar23 & 0x2000000) != MPP_FMT_YUV420SP) {
              y_virstride = y_virstride * 6 + 0xf & 0xfffffff0;
              mapped_idx = (mapped_idx >> 1) + mapped_idx;
            }
          }
          else {
            RVar20 = mpp_frame_get_fbc_hdr_stride(mbuffer);
            y_virstride = RVar20 >> 2;
          }
          switch(fbc_hdr_stride) {
          case 0:
            (dxva->tiles).tile_offset_start[4] = y_virstride >> 4;
            break;
          case 1:
            (dxva->tiles).tile_offset_start[7] = y_virstride >> 4;
            break;
          case 2:
            (dxva->tiles).tile_offset_start[10] = y_virstride >> 4;
            break;
          case 3:
            (dxva->tiles).tile_offset_start[0xd] = y_virstride >> 4;
            break;
          case 4:
            (dxva->tiles).tile_offset_start[0x10] = y_virstride >> 4;
            break;
          case 5:
            (dxva->tiles).tile_offset_start[0x13] = y_virstride >> 4;
            break;
          case 6:
            (dxva->tiles).tile_offset_start[0x16] = y_virstride >> 4;
            break;
          case 7:
            (dxva->tiles).tile_offset_start[0x19] = y_virstride >> 4;
          }
          switch(fbc_hdr_stride) {
          case 0:
            (dxva->tiles).tile_offset_start[5] = y_virstride >> 4;
            break;
          case 1:
            (dxva->tiles).tile_offset_start[8] = y_virstride >> 4;
            break;
          case 2:
            (dxva->tiles).tile_offset_start[0xb] = y_virstride >> 4;
            break;
          case 3:
            (dxva->tiles).tile_offset_start[0xe] = y_virstride >> 4;
            break;
          case 4:
            (dxva->tiles).tile_offset_start[0x11] = y_virstride >> 4;
            break;
          case 5:
            (dxva->tiles).tile_offset_start[0x14] = y_virstride >> 4;
            break;
          case 6:
            (dxva->tiles).tile_offset_start[0x17] = y_virstride >> 4;
            break;
          case 7:
            (dxva->tiles).tile_offset_start[0x1a] = y_virstride >> 4;
          }
          switch(fbc_hdr_stride) {
          case 0:
            (dxva->tiles).tile_offset_start[6] = mapped_idx >> 4;
            break;
          case 1:
            (dxva->tiles).tile_offset_start[9] = mapped_idx >> 4;
            break;
          case 2:
            (dxva->tiles).tile_offset_start[0xc] = mapped_idx >> 4;
            break;
          case 3:
            (dxva->tiles).tile_offset_start[0xf] = mapped_idx >> 4;
            break;
          case 4:
            (dxva->tiles).tile_offset_start[0x12] = mapped_idx >> 4;
            break;
          case 5:
            (dxva->tiles).tile_offset_start[0x15] = mapped_idx >> 4;
            break;
          case 6:
            (dxva->tiles).tile_offset_start[0x18] = mapped_idx >> 4;
            break;
          case 7:
            (dxva->tiles).tile_offset_start[0x1b] = mapped_idx >> 4;
          }
        }
      }
      pvStack_88 = (MppBuffer)0x0;
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)(ctx->reg_buf + 1),(pHStack_18->dec).output,SLOT_FRAME_PTR,&mbuffer
                );
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)(ctx->reg_buf + 1),(pHStack_18->dec).output,SLOT_BUFFER,
                 &stack0xffffffffffffff78);
      UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
      (dxva->tiles).tile_offset_start[0x1c] = UVar22;
      UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
      (dxva->tiles).tile_offset_start[0x34] = UVar22;
      for (origin_buf._4_4_ = 0; origin_buf._4_4_ < 7; origin_buf._4_4_ = origin_buf._4_4_ + 1) {
        mv_buf._4_4_ = pDStack_40->ref_frame_idx[origin_buf._4_4_];
        if ((pDStack_40->frame_refs[mv_buf._4_4_].Index != -1) &&
           (pDStack_40->frame_refs[mv_buf._4_4_].Index != '\x7f')) {
          mpp_buf_slot_get_prop
                    (*(MppBufSlots *)(ctx->reg_buf + 1),
                     (int)pDStack_40->frame_refs[mv_buf._4_4_].Index,SLOT_BUFFER,
                     &stack0xffffffffffffff78);
          lVar19._0_4_ = regs[0xbd].av1d_addrs.reg207_payload_st_ref12_base;
          lVar19._4_4_ = regs[0xbd].av1d_addrs.reg208_payload_st_ref13_base;
          if ((lVar19 != 0) && (RVar20 = mpp_frame_get_thumbnail_en(mbuffer), RVar20 == 2)) {
            mframe = hal_bufs_get_buf(*(HalBufs *)
                                       &regs[0xbd].av1d_addrs.reg207_payload_st_ref12_base,
                                      (int)pDStack_40->frame_refs[mv_buf._4_4_].Index);
            pvStack_88 = *((HalBuf *)mframe)->buf;
          }
          if (pvStack_88 != (MppBuffer)0x0) {
            switch(mv_buf._4_4_) {
            case 0:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x1e] = UVar22;
              break;
            case 1:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x1f] = UVar22;
              break;
            case 2:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x20] = UVar22;
              break;
            case 3:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x21] = UVar22;
              break;
            case 4:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x22] = UVar22;
              break;
            case 5:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x23] = UVar22;
              break;
            case 6:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x24] = UVar22;
              break;
            case 7:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x25] = UVar22;
            }
            switch(mv_buf._4_4_) {
            case 0:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x37] = UVar22;
              break;
            case 1:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x38] = UVar22;
              break;
            case 2:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x39] = UVar22;
              break;
            case 3:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x3a] = UVar22;
              break;
            case 4:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x3b] = UVar22;
              break;
            case 5:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x3c] = UVar22;
              break;
            case 6:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x3d] = UVar22;
              break;
            case 7:
              UVar22 = mpp_buffer_get_fd_with_caller(pvStack_88,"vdpu383_av1d_gen_regs");
              (dxva->tiles).tile_offset_start[0x3e] = UVar22;
            }
          }
        }
      }
      mbuffer_2 = (MppBuffer)0x0;
      vdpu383_av1d_colmv_setup((Av1dHalCtx *)ctx,pDStack_40);
      mbuffer_2 = hal_bufs_get_buf(*(HalBufs *)
                                    &(regs->av1d_paras).reg72_scl_ref_raster_uv_hor_virstride,
                                   (uint)((pDStack_40->CurrPic).field_0.bPicEntry & 0x7f));
      UVar22 = mpp_buffer_get_fd_with_caller(*((HalBuf *)mbuffer_2)->buf,"vdpu383_av1d_gen_regs");
      (dxva->tiles).tile_offset_start[0x4c] = UVar22;
      for (origin_buf._4_4_ = 0; origin_buf._4_4_ < 8; origin_buf._4_4_ = origin_buf._4_4_ + 1) {
        if ((pDStack_40->frame_refs[origin_buf._4_4_].Index != -1) &&
           (pDStack_40->frame_refs[origin_buf._4_4_].Index != '\x7f')) {
          mbuffer_2 = hal_bufs_get_buf(*(HalBufs *)
                                        &(regs->av1d_paras).reg72_scl_ref_raster_uv_hor_virstride,
                                       (int)pDStack_40->frame_refs[origin_buf._4_4_].Index);
          UVar22 = mpp_buffer_get_fd_with_caller
                             (*((HalBuf *)mbuffer_2)->buf,"vdpu383_av1d_gen_regs");
          (dxva->tiles).tile_offset_start[(ulong)origin_buf._4_4_ + 0x4d] = UVar22;
        }
      }
      vdpu383_av1d_cdf_setup((Av1dHalCtx *)ctx,pDStack_40);
      vdpu383_av1d_set_cdf((Av1dHalCtx *)ctx,pDStack_40);
      mpp_buffer_sync_end_f(*(MppBuffer *)&(regs->ctrl_regs).reg23,0,"vdpu383_av1d_gen_regs");
      _thumbnail_mode = (MppBuffer)0x0;
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)(ctx->reg_buf + 1),(pDStack_40->CurrPic).field_0.bPicEntry & 0x7f,
                 SLOT_BUFFER,&thumbnail_mode);
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)(ctx->reg_buf + 1),(pDStack_40->CurrPic).field_0.bPicEntry & 0x7f,
                 SLOT_FRAME_PTR,&mbuffer);
      RVar20 = mpp_frame_get_thumbnail_en(mbuffer);
      iVar21 = mpp_buffer_get_fd_with_caller(_thumbnail_mode,"vdpu383_av1d_gen_regs");
      if (RVar20 != 0) {
        if (RVar20 == 1) {
          *(int *)((dxva->tiles).widths + 0x29) = iVar21;
          vdpu383_setup_down_scale
                    (mbuffer,*(MppDev *)&ctx->bufs_fd,(Vdpu383CtrlReg *)&dxva->height,
                     (dxva->tiles).heights + 0x23);
          return MPP_OK;
        }
        if (RVar20 == 2) {
          *(int *)((dxva->tiles).widths + 0x29) = iVar21;
          mframe = hal_bufs_get_buf(*(HalBufs *)&regs[0xbd].av1d_addrs.reg207_payload_st_ref12_base,
                                    (uint)((pDStack_40->CurrPic).field_0.bPicEntry & 0x7f));
          UVar22 = mpp_buffer_get_fd_with_caller(*((HalBuf *)mframe)->buf,"vdpu383_av1d_gen_regs");
          (dxva->tiles).tile_offset_start[0x1c] = UVar22;
          (dxva->tiles).tile_offset_start[0x34] = UVar22;
          (dxva->tiles).tile_offset_start[0x1d] = UVar22;
          vdpu383_setup_down_scale
                    (mbuffer,*(MppDev *)&ctx->bufs_fd,(Vdpu383CtrlReg *)&dxva->height,
                     (dxva->tiles).heights + 0x23);
          return MPP_OK;
        }
      }
      uVar17._0_2_ = dxva->max_height;
      uVar17._2_2_ = dxva->CurrPicTextureIndex;
      dxva->max_height = (short)(uVar17 & 0xffffffdf);
      dxva->CurrPicTextureIndex = (short)((uVar17 & 0xffffffdf) >> 0x10);
    }
    else {
      _mpp_log_l(2,"hal_av1d_vdpu383","parse err %d ref err %d\n","vdpu383_av1d_gen_regs",
                 (ulong)((uint)((task->dec).flags.val >> 2) & 1),
                 (ulong)((uint)((task->dec).flags.val >> 3) & 1));
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu383_av1d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    Vdpu383Av1dRegCtx *ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    Vdpu383Av1dRegSet *regs;
    DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
    RK_U32 i = 0;
    HalBuf *origin_buf = NULL;
    MppFrame mframe;

    INP_CHECK(ret, NULL == p_hal);

    ctx->refresh_frame_flags = dxva->refresh_frame_flags;

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        mpp_err_f("parse err %d ref err %d\n",
                  task->dec.flags.parse_err, task->dec.flags.ref_err);
        goto __RETURN;
    }

    mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_FRAME_PTR, &mframe);
    if (mpp_frame_get_thumbnail_en(mframe) == MPP_FRAME_THUMBNAIL_ONLY &&
        MPP_MAX(dxva->width, dxva->height) > 4096 && ctx->origin_bufs == NULL) {
        vdpu383_setup_scale_origin_bufs(p_hal, mframe);
    }

    if (p_hal->fast_mode) {
        for (i = 0; i <  MPP_ARRAY_ELEMS(ctx->reg_buf); i++) {
            if (!ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                ctx->regs = ctx->reg_buf[i].regs;
                ctx->reg_buf[i].valid = 1;
                ctx->offset_uncomps = ctx->uncmps_offset[i];
                break;
            }
        }
    }
    regs = ctx->regs;
    memset(regs, 0, sizeof(*regs));
    p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);

#ifdef DUMP_AV1D_VDPU383_DATAS
    {
        memset(dump_cur_dir, 0, sizeof(dump_cur_dir));
        sprintf(dump_cur_dir, "av1/Frame%04d", dump_cur_frame);
        if (access(dump_cur_dir, 0)) {
            if (mkdir(dump_cur_dir))
                mpp_err_f("error: mkdir %s\n", dump_cur_dir);
        }
        dump_cur_frame++;
    }
#endif

    /* set reg -> ctrl reg */
    {
        regs->ctrl_regs.reg8_dec_mode          = 4; // av1
        regs->ctrl_regs.reg9.fbc_e             = 0;
        regs->ctrl_regs.reg9.buf_empty_en      = 0;

        regs->ctrl_regs.reg10.strmd_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.inter_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.intra_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.transd_auto_gating_e   = 1;
        regs->ctrl_regs.reg10.recon_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.filterd_auto_gating_e  = 1;
        regs->ctrl_regs.reg10.bus_auto_gating_e      = 1;
        regs->ctrl_regs.reg10.ctrl_auto_gating_e     = 1;
        regs->ctrl_regs.reg10.rcb_auto_gating_e      = 1;
        regs->ctrl_regs.reg10.err_prc_auto_gating_e  = 1;

        // regs->ctrl_regs.reg11.dec_timeout_dis        = 1;

        regs->ctrl_regs.reg13_core_timeout_threshold  = 0x3fffff;

        regs->ctrl_regs.reg16.error_proc_disable     = 1;
        regs->ctrl_regs.reg16.error_spread_disable   = 0;
        regs->ctrl_regs.reg16.roi_error_ctu_cal_en   = 0;

        regs->ctrl_regs.reg20_cabac_error_en_lowbits  = 0xffffffdf;
        regs->ctrl_regs.reg21_cabac_error_en_highbits = 0x3fffffff;

        regs->ctrl_regs.reg28.axi_perf_work_e = 1;
        regs->ctrl_regs.reg28.axi_cnt_type    = 1;
        regs->ctrl_regs.reg28.rd_latency_id   = 11;

        regs->ctrl_regs.reg29.addr_align_type     = 1;
        regs->ctrl_regs.reg29.ar_cnt_id_type      = 0;
        regs->ctrl_regs.reg29.aw_cnt_id_type      = 1;
        regs->ctrl_regs.reg29.ar_count_id         = 17;
        regs->ctrl_regs.reg29.aw_count_id         = 0;
        regs->ctrl_regs.reg29.rd_band_width_mode  = 0;

        regs->ctrl_regs.reg30.axi_wr_qos = 0;
        regs->ctrl_regs.reg30.axi_rd_qos = 0;
    }

    /* set reg -> pkt data */
    {
        MppBuffer mbuffer = NULL;

        /* uncompress header data */
        prepare_uncompress_header(p_hal, dxva, (RK_U64 *)ctx->header_data, sizeof(ctx->header_data) / 8);
        memcpy((char *)ctx->bufs_ptr, (void *)ctx->header_data, sizeof(ctx->header_data));
        regs->av1d_paras.reg67_global_len = VDPU383_UNCMPS_HEADER_SIZE / 16; // 128 bit as unit
        regs->common_addr.reg131_gbl_base = ctx->bufs_fd;
        // mpp_dev_set_reg_offset(p_hal->dev, 131, ctx->offset_uncomps);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            char *cur_fname = "global_cfg.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, ctx->bufs_ptr,
                              8 * regs->av1d_paras.reg67_global_len * 16, 64, 0, 0);
        }
#endif
        // input strm
        p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);
        regs->av1d_paras.reg66_stream_len = MPP_ALIGN(p_hal->strm_len + 15, 128);
        mpp_buf_slot_get_prop(p_hal->packet_slots, task->dec.input, SLOT_BUFFER, &mbuffer);
        regs->common_addr.reg128_strm_base = mpp_buffer_get_fd(mbuffer);
        regs->av1d_paras.reg65_strm_start_bit = (ctx->offset_uncomps & 0xf) * 8; // bit start to decode
        mpp_dev_set_reg_offset(p_hal->dev, 128, ctx->offset_uncomps & 0xfffffff0);
        /* error */
        regs->av1d_addrs.reg169_error_ref_base = mpp_buffer_get_fd(mbuffer);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            char *cur_fname = "stream_in.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mbuffer)
                              + ctx->offset_uncomps,
                              8 * p_hal->strm_len, 128, 0, 0);
        }
        {
            char *cur_fname = "stream_in_no_offset.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mbuffer),
                              8 * p_hal->strm_len, 128, 0, 0);
        }
#endif
    }

    /* set reg -> rcb */
    vdpu383_av1d_rcb_setup(p_hal, dxva);
    vdpu383_av1d_rcb_reg_cfg(p_hal, p_hal->fast_mode ? ctx->rcb_bufs[task->dec.reg_index] : ctx->rcb_bufs[0]);

    /* set reg -> para (stride, len) */
    {
        RK_U32 hor_virstride = 0;
        RK_U32 ver_virstride = 0;
        RK_U32 y_virstride = 0;
        RK_U32 uv_virstride = 0;
        RK_U32 mapped_idx;

        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_FRAME_PTR, &mframe);
        if (mframe) {
            hor_virstride = mpp_frame_get_hor_stride(mframe);
            ver_virstride = mpp_frame_get_ver_stride(mframe);
            y_virstride = hor_virstride * ver_virstride;
            uv_virstride = hor_virstride * ver_virstride / 2;

            if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
                RK_U32 fbd_offset;
                RK_U32 fbc_hdr_stride = mpp_frame_get_fbc_hdr_stride(mframe);
                RK_U32 h = MPP_ALIGN(mpp_frame_get_height(mframe), 64);

                regs->ctrl_regs.reg9.fbc_e = 1;
                regs->av1d_paras.reg68_hor_virstride = fbc_hdr_stride / 64;
                fbd_offset = regs->av1d_paras.reg68_hor_virstride * h * 4;
                regs->av1d_addrs.reg193_fbc_payload_offset = fbd_offset;
            } else if (MPP_FRAME_FMT_IS_TILE(mpp_frame_get_fmt(mframe))) {
                regs->ctrl_regs.reg9.tile_e = 1;
                regs->av1d_paras.reg68_hor_virstride = MPP_ALIGN(hor_virstride * 6, 16) >> 4;
                regs->av1d_paras.reg70_y_virstride = (y_virstride + uv_virstride) >> 4;
            } else {
                regs->ctrl_regs.reg9.fbc_e = 0;
                regs->av1d_paras.reg68_hor_virstride = hor_virstride >> 4;
                regs->av1d_paras.reg69_raster_uv_hor_virstride = hor_virstride >> 4;
                regs->av1d_paras.reg70_y_virstride = y_virstride >> 4;
            }
            /* error */
            regs->av1d_paras.reg80_error_ref_hor_virstride = regs->av1d_paras.reg68_hor_virstride;
            regs->av1d_paras.reg81_error_ref_raster_uv_hor_virstride = regs->av1d_paras.reg69_raster_uv_hor_virstride;
            regs->av1d_paras.reg82_error_ref_virstride = regs->av1d_paras.reg70_y_virstride;
        }

        for (i = 0; i < ALLOWED_REFS_PER_FRAME_EX; ++i) {
            mapped_idx = dxva->ref_frame_idx[i];
            if (dxva->frame_refs[mapped_idx].Index != (CHAR)0xff && dxva->frame_refs[mapped_idx].Index != 0x7f) {
                mpp_buf_slot_get_prop(p_hal->slots, dxva->frame_refs[mapped_idx].Index, SLOT_FRAME_PTR, &mframe);
                if (mframe) {
                    hor_virstride = mpp_frame_get_hor_stride(mframe);
                    ver_virstride = mpp_frame_get_ver_stride(mframe);
                    y_virstride = hor_virstride * ver_virstride;
                    if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
                        hor_virstride = mpp_frame_get_fbc_hdr_stride(mframe) / 4;
                    } else if (MPP_FRAME_FMT_IS_TILE(mpp_frame_get_fmt(mframe))) {
                        hor_virstride = MPP_ALIGN(hor_virstride * 6, 16);
                        y_virstride += y_virstride / 2;
                    }
                    SET_REF_HOR_VIRSTRIDE(regs->av1d_paras, mapped_idx, hor_virstride >> 4);
                    SET_REF_RASTER_UV_HOR_VIRSTRIDE(regs->av1d_paras, mapped_idx, hor_virstride >> 4);
                    SET_REF_VIRSTRIDE(regs->av1d_paras, mapped_idx, y_virstride >> 4);
                }
            }
        }
    }

    /* set reg -> para (ref, fbc, colmv) */
    {
        MppBuffer mbuffer = NULL;
        RK_U32 mapped_idx;
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_BUFFER, &mbuffer);
        regs->av1d_addrs.reg168_decout_base = mpp_buffer_get_fd(mbuffer);
        regs->av1d_addrs.reg192_payload_st_cur_base = mpp_buffer_get_fd(mbuffer);
        // VDPU383_SET_BUF_PROTECT_VAL(mpp_buffer_get_ptr(mbuffer), mpp_buffer_get_size(mbuffer), 0xbb, 128);

        for (i = 0; i < ALLOWED_REFS_PER_FRAME_EX; i++) {
            mapped_idx = dxva->ref_frame_idx[i];
            if (dxva->frame_refs[mapped_idx].Index != (CHAR)0xff && dxva->frame_refs[mapped_idx].Index != 0x7f) {
                mpp_buf_slot_get_prop(p_hal->slots, dxva->frame_refs[mapped_idx].Index, SLOT_BUFFER, &mbuffer);
                if (ctx->origin_bufs && mpp_frame_get_thumbnail_en(mframe) == MPP_FRAME_THUMBNAIL_ONLY) {
                    origin_buf = hal_bufs_get_buf(ctx->origin_bufs, dxva->frame_refs[mapped_idx].Index);
                    mbuffer = origin_buf->buf[0];
                }
                if (mbuffer) {
                    SET_REF_BASE(regs->av1d_addrs, mapped_idx, mpp_buffer_get_fd(mbuffer));
                    SET_FBC_PAYLOAD_REF_BASE(regs->av1d_addrs, mapped_idx, mpp_buffer_get_fd(mbuffer));
                }
            }
        }

        HalBuf *mv_buf = NULL;
        vdpu383_av1d_colmv_setup(p_hal, dxva);
        mv_buf = hal_bufs_get_buf(ctx->colmv_bufs, dxva->CurrPic.Index7Bits);
        regs->av1d_addrs.reg216_colmv_cur_base = mpp_buffer_get_fd(mv_buf->buf[0]);
#ifdef DUMP_AV1D_VDPU383_DATAS
        memset(mpp_buffer_get_ptr(mv_buf->buf[0]), 0, mpp_buffer_get_size(mv_buf->buf[0]));
#endif
        for (i = 0; i < NUM_REF_FRAMES; i++) {
            if (dxva->frame_refs[i].Index != (CHAR)0xff && dxva->frame_refs[i].Index != 0x7f) {
                mv_buf = hal_bufs_get_buf(ctx->colmv_bufs, dxva->frame_refs[i].Index);
                regs->av1d_addrs.reg217_232_colmv_ref_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
#ifdef DUMP_AV1D_VDPU383_DATAS
                {
                    char *cur_fname = "colmv_ref_frame";
                    memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
                    sprintf(dump_cur_fname_path, "%s/%s%d.dat", dump_cur_dir, cur_fname, i);
                    dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mv_buf->buf[0]),
                                      8 * mpp_buffer_get_size(mv_buf->buf[0]), 64, 0, 0);
                }
#endif
            }
        }
    }

    {
        vdpu383_av1d_cdf_setup(p_hal, dxva);
        vdpu383_av1d_set_cdf(p_hal, dxva);
    }
    mpp_buffer_sync_end(ctx->bufs);

    {
        //scale down config
        MppBuffer mbuffer = NULL;
        RK_S32 fd = -1;
        MppFrameThumbnailMode thumbnail_mode;

        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_BUFFER, &mbuffer);
        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);
        thumbnail_mode = mpp_frame_get_thumbnail_en(mframe);
        fd = mpp_buffer_get_fd(mbuffer);

        switch (thumbnail_mode) {
        case MPP_FRAME_THUMBNAIL_ONLY:
            regs->common_addr.reg133_scale_down_base = fd;
            origin_buf = hal_bufs_get_buf(ctx->origin_bufs, dxva->CurrPic.Index7Bits);
            fd = mpp_buffer_get_fd(origin_buf->buf[0]);
            regs->av1d_addrs.reg168_decout_base = fd;
            regs->av1d_addrs.reg192_payload_st_cur_base = fd;
            regs->av1d_addrs.reg169_error_ref_base = fd;
            vdpu383_setup_down_scale(mframe, p_hal->dev, &regs->ctrl_regs,
                                     (void *)&regs->av1d_paras);
            break;
        case MPP_FRAME_THUMBNAIL_MIXED:
            regs->common_addr.reg133_scale_down_base = fd;
            vdpu383_setup_down_scale(mframe, p_hal->dev, &regs->ctrl_regs,
                                     (void *)&regs->av1d_paras);
            break;
        case MPP_FRAME_THUMBNAIL_NONE:
        default:
            regs->ctrl_regs.reg9.scale_down_en = 0;
            break;
        }
    }

__RETURN:
    return ret = MPP_OK;
}